

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

bool __thiscall MPLSParser::parse(MPLSParser *this,char *fileName)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint8_t *buffer;
  ssize_t sVar4;
  size_t __nbytes;
  int64_t fileSize;
  File file;
  
  File::File(&file);
  __nbytes = 0;
  iVar3 = File::open(&file,fileName,1);
  if ((char)iVar3 != '\0') {
    bVar2 = File::size(&file,&fileSize);
    uVar1 = (uint)fileSize;
    if (bVar2) {
      buffer = (uint8_t *)operator_new__(CONCAT44(fileSize._4_4_,(uint)fileSize));
      sVar4 = File::read(&file,(int)buffer,(void *)(ulong)uVar1,__nbytes);
      bVar2 = (int)sVar4 != 0;
      if (bVar2) {
        parse(this,buffer,(uint)fileSize);
      }
      operator_delete__(buffer);
      goto LAB_001e601e;
    }
  }
  bVar2 = false;
LAB_001e601e:
  File::~File(&file);
  return bVar2;
}

Assistant:

bool MPLSParser::parse(const char* fileName)
{
    File file;
    if (!file.open(fileName, File::ofRead))
        return false;
    int64_t fileSize;
    if (!file.size(&fileSize))
        return false;
    const auto buffer = new uint8_t[fileSize];
    if (!file.read(buffer, static_cast<uint32_t>(fileSize)))
    {
        delete[] buffer;
        return false;
    }
    try
    {
        parse(buffer, static_cast<int>(fileSize));
        delete[] buffer;
        return true;
    }
    catch (...)
    {
        delete[] buffer;
        return false;
    }
}